

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>,_phmap::priv::(anonymous_namespace)::StringLike_&,_phmap::priv::(anonymous_namespace)::StringLike_*>
* __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>,_phmap::priv::(anonymous_namespace)::StringLike_&,_phmap::priv::(anonymous_namespace)::StringLike_*>
::operator++(btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>,_phmap::priv::(anonymous_namespace)::StringLike_&,_phmap::priv::(anonymous_namespace)::StringLike_*>
             *this)

{
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>,_phmap::priv::(anonymous_namespace)::StringLike_&,_phmap::priv::(anonymous_namespace)::StringLike_*>
  *this_local;
  
  increment(this);
  return this;
}

Assistant:

btree_iterator& operator++() {
            increment();
            return *this;
        }